

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O3

void Waitone(IceTCommunicator self,IceTCommRequest *icet_request)

{
  MPI_Request mpi_request;
  IceTCommRequest local_18;
  
  local_18 = *icet_request;
  if (local_18 != (IceTCommRequest)0x0) {
    if (local_18->magic_number == 0xd7168b00) {
      local_18 = *local_18->internals;
    }
    else {
      icetRaiseDiagnostic("Request object is not from the MPI communicator.",0xfffffffa,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                          ,99);
      local_18 = (IceTCommRequest)&ompi_request_null;
    }
    MPI_Wait(&local_18,0);
    setMPIRequest(*icet_request,(MPI_Request)local_18);
    destroy_request(*icet_request);
    *icet_request = (IceTCommRequest)0x0;
  }
  return;
}

Assistant:

static void Waitone(IceTCommunicator self, IceTCommRequest *icet_request)
{
    MPI_Request mpi_request;

    /* To remove warning */
    (void)self;

    if (*icet_request == ICET_COMM_REQUEST_NULL) return;

    mpi_request = getMPIRequest(*icet_request);
    MPI_Wait(&mpi_request, MPI_STATUS_IGNORE);
    setMPIRequest(*icet_request, mpi_request);

    destroy_request(*icet_request);
    *icet_request = ICET_COMM_REQUEST_NULL;
}